

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QNetworkCookie>::append(QList<QNetworkCookie> *this,QList<QNetworkCookie> *other)

{
  bool bVar1;
  QArrayDataPointer<QNetworkCookie> *in_RSI;
  QList<QNetworkCookie> *in_RDI;
  QArrayDataPointer<QNetworkCookie> *in_stack_ffffffffffffffe0;
  
  bVar1 = isEmpty((QList<QNetworkCookie> *)0x1bfa86);
  if (!bVar1) {
    QArrayDataPointer<QNetworkCookie>::operator->(in_RSI);
    QArrayDataPointer<QNetworkCookie>::needsDetach(in_stack_ffffffffffffffe0);
    append((QList<QNetworkCookie> *)in_RSI,in_RDI);
  }
  return;
}

Assistant:

inline void QList<T>::append(QList<T> &&other)
{
    Q_ASSERT(&other != this);
    if (other.isEmpty())
        return;
    if (other.d->needsDetach() || !std::is_nothrow_move_constructible_v<T>)
        return append(other);

    // due to precondition &other != this, we can unconditionally modify 'this'
    d.detachAndGrow(QArrayData::GrowsAtEnd, other.size(), nullptr, nullptr);
    Q_ASSERT(d.freeSpaceAtEnd() >= other.size());
    d->moveAppend(other.d->begin(), other.d->end());
}